

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::NavMoveRequestSubmit
               (ImGuiDir move_dir,ImGuiDir clip_dir,ImGuiNavMoveFlags move_flags,
               ImGuiScrollFlags scroll_flags)

{
  ImGuiContext *pIVar1;
  ImGuiContext *g;
  ImGuiScrollFlags scroll_flags_local;
  ImGuiNavMoveFlags move_flags_local;
  ImGuiDir clip_dir_local;
  ImGuiDir move_dir_local;
  
  pIVar1 = GImGui;
  if (GImGui->NavWindow != (ImGuiWindow *)0x0) {
    g._4_4_ = move_flags;
    if ((move_flags & 0x400U) != 0) {
      g._4_4_ = move_flags | 0x10;
    }
    GImGui->NavMoveScoringItems = true;
    pIVar1->NavMoveSubmitted = true;
    pIVar1->NavMoveDir = move_dir;
    pIVar1->NavMoveDirForDebug = move_dir;
    pIVar1->NavMoveClipDir = clip_dir;
    pIVar1->NavMoveFlags = g._4_4_;
    pIVar1->NavMoveScrollFlags = scroll_flags;
    pIVar1->NavMoveForwardToNextFrame = false;
    pIVar1->NavMoveKeyMods = (pIVar1->IO).KeyMods;
    pIVar1->NavTabbingCounter = 0;
    ImGuiNavItemData::Clear(&pIVar1->NavMoveResultLocal);
    ImGuiNavItemData::Clear(&pIVar1->NavMoveResultLocalVisible);
    ImGuiNavItemData::Clear(&pIVar1->NavMoveResultOther);
    NavUpdateAnyRequestFlag();
    return;
  }
  __assert_fail("g.NavWindow != __null",
                "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/imgui-src/imgui.cpp"
                ,0x2917,
                "void ImGui::NavMoveRequestSubmit(ImGuiDir, ImGuiDir, ImGuiNavMoveFlags, ImGuiScrollFlags)"
               );
}

Assistant:

void ImGui::NavMoveRequestSubmit(ImGuiDir move_dir, ImGuiDir clip_dir, ImGuiNavMoveFlags move_flags, ImGuiScrollFlags scroll_flags)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(g.NavWindow != NULL);

    if (move_flags & ImGuiNavMoveFlags_Tabbing)
        move_flags |= ImGuiNavMoveFlags_AllowCurrentNavId;

    g.NavMoveSubmitted = g.NavMoveScoringItems = true;
    g.NavMoveDir = move_dir;
    g.NavMoveDirForDebug = move_dir;
    g.NavMoveClipDir = clip_dir;
    g.NavMoveFlags = move_flags;
    g.NavMoveScrollFlags = scroll_flags;
    g.NavMoveForwardToNextFrame = false;
    g.NavMoveKeyMods = g.IO.KeyMods;
    g.NavTabbingCounter = 0;
    g.NavMoveResultLocal.Clear();
    g.NavMoveResultLocalVisible.Clear();
    g.NavMoveResultOther.Clear();
    NavUpdateAnyRequestFlag();
}